

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::set_config
          (App *this,string *option_name,string *default_filename,string *help_message,
          bool config_required)

{
  bool bVar1;
  Option *pOVar2;
  long in_RDI;
  byte in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  App *in_stack_00000010;
  string *val;
  Option *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  Option *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  if (*(long *)(in_RDI + 0x348) != 0) {
    remove_option((App *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    *(undefined8 *)(in_RDI + 0x348) = 0;
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18d90f);
  if (!bVar1) {
    this_00 = (Option *)&stack0xffffffffffffffb8;
    ::std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pOVar2 = add_option<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    *(Option **)(in_RDI + 0x348) = pOVar2;
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    if ((in_R8B & 1) != 0) {
      OptionBase<CLI::Option>::required(*(OptionBase<CLI::Option> **)(in_RDI + 0x348),true);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18d9ad
                      );
    if (!bVar1) {
      val = *(string **)(in_RDI + 0x348);
      ::std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      Option::default_str(this_00,val);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      *(undefined1 *)(*(long *)(in_RDI + 0x348) + 0x24e) = 1;
    }
    OptionBase<CLI::Option>::configurable(*(OptionBase<CLI::Option> **)(in_RDI + 0x348),false);
    Option::multi_option_policy(*(Option **)(in_RDI + 0x348),Reverse);
  }
  return *(Option **)(in_RDI + 0x348);
}

Assistant:

CLI11_INLINE Option *App::set_config(std::string option_name,
                                     std::string default_filename,
                                     const std::string &help_message,
                                     bool config_required) {

    // Remove existing config if present
    if(config_ptr_ != nullptr) {
        remove_option(config_ptr_);
        config_ptr_ = nullptr;  // need to remove the config_ptr completely
    }

    // Only add config if option passed
    if(!option_name.empty()) {
        config_ptr_ = add_option(option_name, help_message);
        if(config_required) {
            config_ptr_->required();
        }
        if(!default_filename.empty()) {
            config_ptr_->default_str(std::move(default_filename));
            config_ptr_->force_callback_ = true;
        }
        config_ptr_->configurable(false);
        // set the option to take the last value and reverse given by default
        config_ptr_->multi_option_policy(MultiOptionPolicy::Reverse);
    }

    return config_ptr_;
}